

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O2

void Bmc_GiaGenerateJustNonRec(Gia_Man_t *p,int iFrame,Vec_Bit_t *vValues,Vec_Bit_t *vJustis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  ulong uVar7;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  undefined8 extraout_RDX;
  int iVar8;
  int i;
  int v;
  bool bVar9;
  
  v = p->nObjs;
  iVar1 = v * iFrame;
  do {
    if (iFrame < 0) {
      return;
    }
LAB_00483d38:
    iVar8 = v;
    if (0 < iVar8) {
      v = iVar8 + -1;
      pGVar5 = Gia_ManObj(p,v);
      if (pGVar5 == (Gia_Obj_t *)0x0) goto LAB_00483ebb;
      if ((iVar8 != 1) && (iVar2 = Gia_ObjIsPi(p,pGVar5), iVar2 == 0)) {
        iVar8 = iVar8 + iVar1 + -1;
        iVar2 = Vec_BitEntry(vJustis,iVar8);
        if (iVar2 != 0) {
          iVar2 = v + iVar1;
          uVar4 = (uint)*(ulong *)pGVar5;
          uVar7 = *(ulong *)pGVar5 & 0x1fffffff;
          if (uVar7 == 0x1fffffff || (int)uVar4 < 0) {
            bVar9 = (int)uVar7 == 0x1fffffff;
            iVar8 = (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),-1 < (int)uVar4 || bVar9);
            if (-1 < (int)uVar4 || bVar9) {
              if ((iFrame == 0) || ((uVar4 & 0x9fffffff) != 0x9fffffff)) goto LAB_00483d38;
              iVar8 = p->nObjs;
              pGVar5 = Gia_ObjRoToRi(p,pGVar5);
              iVar2 = Gia_ObjId(p,pGVar5);
              iVar2 = iVar2 + (iVar1 - iVar8);
              iVar8 = extraout_EDX_00;
            }
            else {
              iVar2 = iVar2 - (uVar4 & 0x1fffffff);
            }
          }
          else {
            iVar3 = Vec_BitEntry(vValues,iVar8);
            i = iVar8 - (*(uint *)pGVar5 & 0x1fffffff);
            if (iVar3 == 0) {
              uVar4 = Vec_BitEntry(vValues,i);
              uVar6 = (uint)*(undefined8 *)pGVar5;
              if (uVar4 == ((uVar6 >> 0x1d & 1) != 0)) {
                iVar2 = iVar8 - (uVar6 & 0x1fffffff);
                iVar8 = extraout_EDX_01;
              }
              else {
                uVar4 = Vec_BitEntry(vValues,iVar8 - ((uint)((ulong)*(undefined8 *)pGVar5 >> 0x20) &
                                                     0x1fffffff));
                if (uVar4 != ((*(ulong *)pGVar5 >> 0x3d & 1) != 0)) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                                ,0x61,
                                "void Bmc_GiaGenerateJustNonRec(Gia_Man_t *, int, Vec_Bit_t *, Vec_Bit_t *)"
                               );
                }
                iVar2 = iVar2 - ((uint)(*(ulong *)pGVar5 >> 0x20) & 0x1fffffff);
                iVar8 = extraout_EDX_02;
              }
            }
            else {
              Vec_BitWriteEntry(vJustis,i,0x1fffffff);
              iVar2 = iVar2 - (*(uint *)&pGVar5->field_0x4 & 0x1fffffff);
              iVar8 = extraout_EDX;
            }
          }
          Vec_BitWriteEntry(vJustis,iVar2,iVar8);
        }
      }
      goto LAB_00483d38;
    }
LAB_00483ebb:
    iFrame = iFrame + -1;
    v = p->nObjs;
    iVar1 = iVar1 - v;
  } while( true );
}

Assistant:

void Bmc_GiaGenerateJustNonRec( Gia_Man_t * p, int iFrame, Vec_Bit_t * vValues, Vec_Bit_t * vJustis )
{
    Gia_Obj_t * pObj;
    int i, k, Shift = Gia_ManObjNum(p) * iFrame;
    for ( i = iFrame; i >= 0; i--, Shift -= Gia_ManObjNum(p) )
    {
        Gia_ManForEachObjReverse( p, pObj, k )
        {
            if ( k == 0 || Gia_ObjIsPi(p, pObj) )
                continue;
            if ( !Vec_BitEntry( vJustis, Shift + k ) )
                continue;
            if ( Gia_ObjIsAnd(pObj) )
            {
                if ( Vec_BitEntry( vValues, Shift + k ) )
                {
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId0(pObj, k), 1 );
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId1(pObj, k), 1 );
                }
                else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId0(pObj, k) ) == Gia_ObjFaninC0(pObj) )
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId0(pObj, k), 1 );
                else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId1(pObj, k) ) == Gia_ObjFaninC1(pObj) )
                    Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId1(pObj, k), 1 );
                else assert( 0 );
            }
            else if ( Gia_ObjIsCo(pObj) )
                Vec_BitWriteEntry( vJustis, Shift + Gia_ObjFaninId0(pObj, k), 1 );
            else if ( Gia_ObjIsCi(pObj) && i )
                Vec_BitWriteEntry( vJustis, Shift - Gia_ManObjNum(p) + Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)), 1 );
        }
    }
}